

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double i4_choose_log(int n,int k)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double value;
  int k_local;
  int n_local;
  
  dVar1 = lgamma((double)(n + 1));
  dVar2 = lgamma((double)(k + 1));
  dVar3 = lgamma((double)((n - k) + 1));
  return (dVar1 - dVar2) - dVar3;
}

Assistant:

double i4_choose_log ( int n, int k )

//****************************************************************************80
//
//  Purpose:
//
//    I4_CHOOSE_LOG computes the logarithm of the Binomial coefficient.
//
//  Discussion:
//
//    LOG ( C(N,K) ) = LOG ( N! / ( K! * (N-K)! ) ).
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    05 March 2016
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, K, are the values of N and K.
//
//    Output, double I4_CHOOSE_LOG, the logarithm of C(N,K).
//
{
  double value;

  value = 
      lgamma ( static_cast<double>(n + 1 ) ) 
    - lgamma ( static_cast<double>(k + 1 ) ) 
    - lgamma ( static_cast<double>(n - k + 1 ) );

  return value;
}